

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

Operand * __thiscall IrSim::newLabel(Operand *__return_storage_ptr__,IrSim *this)

{
  int __val;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = this->labelSeq;
  this->labelSeq = __val + 1;
  std::__cxx11::to_string(&sStack_58,__val);
  std::operator+(&local_38,&this->labelPrefix,&sStack_58);
  Operand::Operand(__return_storage_ptr__,3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return __return_storage_ptr__;
}

Assistant:

Operand newLabel()  { return Operand(OP_LABEL,    labelPrefix  + to_string(labelSeq++)); }